

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

int Pdr_ManCountVariables(Pdr_Man_t *p,int kStart)

{
  int *__ptr;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *__ptr_00;
  long lVar1;
  int iVar2;
  
  vCubes = Pdr_ManCollectCubes(p,kStart);
  __ptr_00 = Pdr_ManCountFlops(p,vCubes);
  __ptr = __ptr_00->pArray;
  if ((long)__ptr_00->nSize < 1) {
    iVar2 = 0;
    if (__ptr == (int *)0x0) goto LAB_00554457;
  }
  else {
    lVar1 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(0 < __ptr[lVar1]);
      lVar1 = lVar1 + 1;
    } while (__ptr_00->nSize != lVar1);
  }
  free(__ptr);
LAB_00554457:
  free(__ptr_00);
  if (vCubes->pArray != (void **)0x0) {
    free(vCubes->pArray);
  }
  free(vCubes);
  return iVar2;
}

Assistant:

int Pdr_ManCountVariables( Pdr_Man_t * p, int kStart )
{
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    int i, Entry, Counter = 0;
    vCubes = Pdr_ManCollectCubes( p, kStart );
    vFlopCounts = Pdr_ManCountFlops( p, vCubes );
    Vec_IntForEachEntry( vFlopCounts, Entry, i )
        Counter += (Entry > 0);
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    return Counter;
}